

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markov-2.cpp
# Opt level: O3

int main(void)

{
  bool bVar1;
  result_type_conflict1 rVar2;
  size_t __i;
  ostream *poVar3;
  long lVar4;
  double *pdVar5;
  pointer pdVar6;
  undefined8 *puVar7;
  size_t sVar8;
  ulong uVar9;
  int iVar10;
  double *w;
  pointer pdVar11;
  bool bVar12;
  double dVar13;
  vector<double,_std::allocator<double>_> weights;
  markov<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
  mc;
  engine_type eng;
  metropolis local_1429;
  double local_1428;
  double local_1420;
  double local_1418;
  ulong uStack_1410;
  double local_1400;
  vector<double,_std::allocator<double>_> local_13f8;
  markov_impl<unsigned_long> local_13d8;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"number of bins = ",0x11)
  ;
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"number of samples = ",0x14);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  local_13b8._M_x[0] = 0x72e3;
  lVar4 = 1;
  uVar9 = 0x72e3;
  do {
    uVar9 = (ulong)(((uint)(uVar9 >> 0x1e) ^ (uint)uVar9) * 0x6c078965 + (int)lVar4);
    local_13b8._M_x[lVar4] = uVar9;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x270);
  local_13b8._M_p = 0x270;
  local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pdVar5 = (double *)operator_new(0x10);
  local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = pdVar5 + 2;
  *pdVar5 = 0.0;
  pdVar5[1] = 0.0;
  lVar4 = 0;
  local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = pdVar5;
  local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  do {
    dVar13 = std::
             generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                       (&local_13b8);
    *(double *)((long)pdVar5 + lVar4) = (dVar13 + 0.0) * 0.001 + 1.0;
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x10);
  local_1420 = 0.0;
  for (pdVar6 = local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar6 != local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar6 = pdVar6 + 1) {
    local_1420 = local_1420 + *pdVar6;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[weights]\n",10);
  pdVar6 = local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start !=
      local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_finish) {
    pdVar11 = local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      poVar3 = std::ostream::_M_insert<double>(*pdVar11);
      local_13d8.dim._0_1_ = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_13d8,1);
      pdVar11 = pdVar11 + 1;
    } while (pdVar11 != pdVar6);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
  std::ostream::put(-0x38);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[Metropolis]\n",0xd);
  bcl::markov_impl<unsigned_long>::
  markov_impl<bcl::metropolis,std::vector<double,std::allocator<double>>>
            (&local_13d8,&local_1429,&local_13f8);
  puVar7 = (undefined8 *)operator_new(0x10);
  *puVar7 = 0;
  puVar7[1] = 0;
  sVar8 = 0;
  iVar10 = 10000000;
  do {
    rVar2 = bcl::detail::random_choice_walker<unsigned_long,unsigned_int,double,void>::operator()
                      ((random_choice_walker<unsigned_long,unsigned_int,double,void> *)
                       (local_13d8.rc_.
                        super__Vector_base<bcl::random_choice<unsigned_long>,_std::allocator<bcl::random_choice<unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + (int)sVar8),&local_13b8);
    sVar8 = (size_t)rVar2;
    puVar7[(int)rVar2] = (double)puVar7[(int)rVar2] + 1.0;
    iVar10 = iVar10 + -1;
  } while (iVar10 != 0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"bin\tweight\t\tresult\t\tdiff\t\tsigma\t\tdiff/sigma\n",0x2c);
  lVar4 = 0;
  bVar1 = true;
  do {
    bVar12 = bVar1;
    local_1418 = local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar4];
    uStack_1410 = 0;
    dVar13 = (double)puVar7[lVar4];
    local_1400 = dVar13 / -10000000.0;
    if (dVar13 < 0.0) {
      dVar13 = sqrt(dVar13);
    }
    else {
      dVar13 = SQRT(dVar13);
    }
    local_1428 = dVar13 / 10000000.0;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t",1);
    poVar3 = std::ostream::_M_insert<double>
                       (local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar4] / local_1420);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"    \t",5);
    poVar3 = std::ostream::_M_insert<double>((double)puVar7[lVar4] / 10000000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"    \t",5);
    local_1418 = ABS(local_1418 / local_1420 + local_1400);
    uStack_1410 = uStack_1410 & 0x7fffffffffffffff;
    poVar3 = std::ostream::_M_insert<double>(local_1418);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"    \t",5);
    poVar3 = std::ostream::_M_insert<double>(local_1428);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"    \t",5);
    poVar3 = std::ostream::_M_insert<double>(local_1418 / local_1428);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    lVar4 = 1;
    bVar1 = false;
  } while (bVar12);
  operator_delete(puVar7,0x10);
  std::
  vector<bcl::random_choice<unsigned_long>,_std::allocator<bcl::random_choice<unsigned_long>_>_>::
  ~vector(&local_13d8.rc_);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"[Metropolis (choose_next)]\n",0x1b);
  puVar7 = (undefined8 *)operator_new(0x10);
  *puVar7 = 0;
  puVar7[1] = 0;
  iVar10 = 10000000;
  do {
    sVar8 = bcl::metropolis::
            choose_next<std::vector<double,std::allocator<double>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                      (&local_13f8,(long)(int)sVar8,&local_13b8);
    puVar7[(int)sVar8] = (double)puVar7[(int)sVar8] + 1.0;
    iVar10 = iVar10 + -1;
  } while (iVar10 != 0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"bin\tweight\t\tresult\t\tdiff\t\tsigma\t\tdiff/sigma\n",0x2c);
  lVar4 = 0;
  bVar1 = true;
  do {
    bVar12 = bVar1;
    local_1418 = local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar4];
    uStack_1410 = 0;
    dVar13 = (double)puVar7[lVar4];
    local_1400 = dVar13 / -10000000.0;
    if (dVar13 < 0.0) {
      dVar13 = sqrt(dVar13);
    }
    else {
      dVar13 = SQRT(dVar13);
    }
    local_1428 = dVar13 / 10000000.0;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t",1);
    poVar3 = std::ostream::_M_insert<double>
                       (local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar4] / local_1420);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"    \t",5);
    poVar3 = std::ostream::_M_insert<double>((double)puVar7[lVar4] / 10000000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"    \t",5);
    local_1418 = ABS(local_1418 / local_1420 + local_1400);
    uStack_1410 = uStack_1410 & 0x7fffffffffffffff;
    poVar3 = std::ostream::_M_insert<double>(local_1418);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"    \t",5);
    poVar3 = std::ostream::_M_insert<double>(local_1428);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"    \t",5);
    poVar3 = std::ostream::_M_insert<double>(local_1418 / local_1428);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    lVar4 = 1;
    bVar1 = false;
  } while (bVar12);
  operator_delete(puVar7,0x10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[heat bath]\n",0xc);
  bcl::markov_impl<unsigned_long>::
  markov_impl<bcl::heatbath,std::vector<double,std::allocator<double>>>
            (&local_13d8,(heatbath *)&local_1429,&local_13f8);
  puVar7 = (undefined8 *)operator_new(0x10);
  *puVar7 = 0;
  puVar7[1] = 0;
  iVar10 = 10000000;
  do {
    rVar2 = bcl::detail::random_choice_walker<unsigned_long,unsigned_int,double,void>::operator()
                      ((random_choice_walker<unsigned_long,unsigned_int,double,void> *)
                       (local_13d8.rc_.
                        super__Vector_base<bcl::random_choice<unsigned_long>,_std::allocator<bcl::random_choice<unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + (int)sVar8),&local_13b8);
    sVar8 = (size_t)rVar2;
    puVar7[(int)rVar2] = (double)puVar7[(int)rVar2] + 1.0;
    iVar10 = iVar10 + -1;
  } while (iVar10 != 0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"bin\tweight\t\tresult\t\tdiff\t\tsigma\t\tdiff/sigma\n",0x2c);
  lVar4 = 0;
  bVar1 = true;
  do {
    bVar12 = bVar1;
    local_1418 = local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar4];
    uStack_1410 = 0;
    dVar13 = (double)puVar7[lVar4];
    local_1400 = dVar13 / -10000000.0;
    if (dVar13 < 0.0) {
      dVar13 = sqrt(dVar13);
    }
    else {
      dVar13 = SQRT(dVar13);
    }
    local_1428 = dVar13 / 10000000.0;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t",1);
    poVar3 = std::ostream::_M_insert<double>
                       (local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar4] / local_1420);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"    \t",5);
    poVar3 = std::ostream::_M_insert<double>((double)puVar7[lVar4] / 10000000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"    \t",5);
    local_1418 = ABS(local_1418 / local_1420 + local_1400);
    uStack_1410 = uStack_1410 & 0x7fffffffffffffff;
    poVar3 = std::ostream::_M_insert<double>(local_1418);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"    \t",5);
    poVar3 = std::ostream::_M_insert<double>(local_1428);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"    \t",5);
    poVar3 = std::ostream::_M_insert<double>(local_1418 / local_1428);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    lVar4 = 1;
    bVar1 = false;
  } while (bVar12);
  operator_delete(puVar7,0x10);
  std::
  vector<bcl::random_choice<unsigned_long>,_std::allocator<bcl::random_choice<unsigned_long>_>_>::
  ~vector(&local_13d8.rc_);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"[heat bath (choose_next)]\n",0x1a);
  puVar7 = (undefined8 *)operator_new(0x10);
  *puVar7 = 0;
  puVar7[1] = 0;
  iVar10 = 10000000;
  do {
    sVar8 = bcl::heatbath::
            choose_next<std::vector<double,std::allocator<double>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                      (&local_13f8,(int)sVar8,&local_13b8);
    puVar7[(int)sVar8] = (double)puVar7[(int)sVar8] + 1.0;
    iVar10 = iVar10 + -1;
  } while (iVar10 != 0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"bin\tweight\t\tresult\t\tdiff\t\tsigma\t\tdiff/sigma\n",0x2c);
  lVar4 = 0;
  bVar1 = true;
  do {
    bVar12 = bVar1;
    local_1418 = local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar4];
    uStack_1410 = 0;
    dVar13 = (double)puVar7[lVar4];
    local_1400 = dVar13 / -10000000.0;
    if (dVar13 < 0.0) {
      dVar13 = sqrt(dVar13);
    }
    else {
      dVar13 = SQRT(dVar13);
    }
    local_1428 = dVar13 / 10000000.0;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t",1);
    poVar3 = std::ostream::_M_insert<double>
                       (local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar4] / local_1420);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"    \t",5);
    poVar3 = std::ostream::_M_insert<double>((double)puVar7[lVar4] / 10000000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"    \t",5);
    local_1418 = ABS(local_1418 / local_1420 + local_1400);
    uStack_1410 = uStack_1410 & 0x7fffffffffffffff;
    poVar3 = std::ostream::_M_insert<double>(local_1418);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"    \t",5);
    poVar3 = std::ostream::_M_insert<double>(local_1428);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"    \t",5);
    poVar3 = std::ostream::_M_insert<double>(local_1418 / local_1428);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    lVar4 = 1;
    bVar1 = false;
  } while (bVar12);
  operator_delete(puVar7,0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"[Suwa-Todo 2010]\n",0x11);
  bcl::markov_impl<unsigned_long>::
  markov_impl<bcl::st2010,std::vector<double,std::allocator<double>>>
            (&local_13d8,(st2010 *)&local_1429,&local_13f8);
  puVar7 = (undefined8 *)operator_new(0x10);
  *puVar7 = 0;
  puVar7[1] = 0;
  iVar10 = 10000000;
  do {
    rVar2 = bcl::detail::random_choice_walker<unsigned_long,unsigned_int,double,void>::operator()
                      ((random_choice_walker<unsigned_long,unsigned_int,double,void> *)
                       (local_13d8.rc_.
                        super__Vector_base<bcl::random_choice<unsigned_long>,_std::allocator<bcl::random_choice<unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + (int)sVar8),&local_13b8);
    sVar8 = (size_t)rVar2;
    puVar7[(int)rVar2] = (double)puVar7[(int)rVar2] + 1.0;
    iVar10 = iVar10 + -1;
  } while (iVar10 != 0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"bin\tweight\t\tresult\t\tdiff\t\tsigma\t\tdiff/sigma\n",0x2c);
  lVar4 = 0;
  bVar1 = true;
  do {
    bVar12 = bVar1;
    local_1418 = local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar4];
    uStack_1410 = 0;
    dVar13 = (double)puVar7[lVar4];
    local_1400 = dVar13 / -10000000.0;
    if (dVar13 < 0.0) {
      dVar13 = sqrt(dVar13);
    }
    else {
      dVar13 = SQRT(dVar13);
    }
    local_1428 = dVar13 / 10000000.0;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t",1);
    poVar3 = std::ostream::_M_insert<double>
                       (local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar4] / local_1420);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"    \t",5);
    poVar3 = std::ostream::_M_insert<double>((double)puVar7[lVar4] / 10000000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"    \t",5);
    local_1418 = ABS(local_1418 / local_1420 + local_1400);
    uStack_1410 = uStack_1410 & 0x7fffffffffffffff;
    poVar3 = std::ostream::_M_insert<double>(local_1418);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"    \t",5);
    poVar3 = std::ostream::_M_insert<double>(local_1428);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"    \t",5);
    poVar3 = std::ostream::_M_insert<double>(local_1418 / local_1428);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    lVar4 = 1;
    bVar1 = false;
  } while (bVar12);
  operator_delete(puVar7,0x10);
  std::
  vector<bcl::random_choice<unsigned_long>,_std::allocator<bcl::random_choice<unsigned_long>_>_>::
  ~vector(&local_13d8.rc_);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"[Suwa-Todo 2010 (choose_next)]\n",0x1f);
  puVar7 = (undefined8 *)operator_new(0x10);
  *puVar7 = 0;
  puVar7[1] = 0;
  iVar10 = 10000000;
  do {
    sVar8 = bcl::st2010::
            choose_next<std::vector<double,std::allocator<double>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                      (&local_13f8,(long)(int)sVar8,&local_13b8);
    puVar7[(int)sVar8] = (double)puVar7[(int)sVar8] + 1.0;
    iVar10 = iVar10 + -1;
  } while (iVar10 != 0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"bin\tweight\t\tresult\t\tdiff\t\tsigma\t\tdiff/sigma\n",0x2c);
  lVar4 = 0;
  bVar1 = true;
  do {
    bVar12 = bVar1;
    local_1418 = local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar4];
    uStack_1410 = 0;
    dVar13 = (double)puVar7[lVar4];
    local_1400 = dVar13 / -10000000.0;
    if (dVar13 < 0.0) {
      dVar13 = sqrt(dVar13);
    }
    else {
      dVar13 = SQRT(dVar13);
    }
    local_1428 = dVar13 / 10000000.0;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t",1);
    poVar3 = std::ostream::_M_insert<double>
                       (local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar4] / local_1420);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"    \t",5);
    poVar3 = std::ostream::_M_insert<double>((double)puVar7[lVar4] / 10000000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"    \t",5);
    local_1418 = ABS(local_1418 / local_1420 + local_1400);
    uStack_1410 = uStack_1410 & 0x7fffffffffffffff;
    poVar3 = std::ostream::_M_insert<double>(local_1418);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"    \t",5);
    poVar3 = std::ostream::_M_insert<double>(local_1428);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"    \t",5);
    poVar3 = std::ostream::_M_insert<double>(local_1418 / local_1428);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    lVar4 = 1;
    bVar1 = false;
  } while (bVar12);
  operator_delete(puVar7,0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"[Suwa-Todo 2013]\n",0x11);
  bcl::markov_impl<unsigned_long>::
  markov_impl<bcl::st2013,std::vector<double,std::allocator<double>>>
            (&local_13d8,(st2013 *)&local_1429,&local_13f8);
  puVar7 = (undefined8 *)operator_new(0x10);
  *puVar7 = 0;
  puVar7[1] = 0;
  iVar10 = 10000000;
  do {
    rVar2 = bcl::detail::random_choice_walker<unsigned_long,unsigned_int,double,void>::operator()
                      ((random_choice_walker<unsigned_long,unsigned_int,double,void> *)
                       (local_13d8.rc_.
                        super__Vector_base<bcl::random_choice<unsigned_long>,_std::allocator<bcl::random_choice<unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + (int)sVar8),&local_13b8);
    sVar8 = (size_t)rVar2;
    puVar7[(int)rVar2] = (double)puVar7[(int)rVar2] + 1.0;
    iVar10 = iVar10 + -1;
  } while (iVar10 != 0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"bin\tweight\t\tresult\t\tdiff\t\tsigma\t\tdiff/sigma\n",0x2c);
  lVar4 = 0;
  bVar1 = true;
  do {
    bVar12 = bVar1;
    local_1418 = local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar4];
    uStack_1410 = 0;
    dVar13 = (double)puVar7[lVar4];
    local_1400 = dVar13 / -10000000.0;
    if (dVar13 < 0.0) {
      dVar13 = sqrt(dVar13);
    }
    else {
      dVar13 = SQRT(dVar13);
    }
    local_1428 = dVar13 / 10000000.0;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t",1);
    poVar3 = std::ostream::_M_insert<double>
                       (local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar4] / local_1420);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"    \t",5);
    poVar3 = std::ostream::_M_insert<double>((double)puVar7[lVar4] / 10000000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"    \t",5);
    local_1418 = ABS(local_1418 / local_1420 + local_1400);
    uStack_1410 = uStack_1410 & 0x7fffffffffffffff;
    poVar3 = std::ostream::_M_insert<double>(local_1418);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"    \t",5);
    poVar3 = std::ostream::_M_insert<double>(local_1428);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"    \t",5);
    poVar3 = std::ostream::_M_insert<double>(local_1418 / local_1428);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    lVar4 = 1;
    bVar1 = false;
  } while (bVar12);
  operator_delete(puVar7,0x10);
  std::
  vector<bcl::random_choice<unsigned_long>,_std::allocator<bcl::random_choice<unsigned_long>_>_>::
  ~vector(&local_13d8.rc_);
  if (local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (double *)0x0) {
    operator_delete(local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_13f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main() {
try {
  std::cout << "number of bins = " << n << std::endl;
  std::cout << "number of samples = " << samples << std::endl;

  // random number generator
  typedef std::mt19937 engine_type;
  engine_type eng(29411);
  std::uniform_real_distribution<> dist;

  // generate weights
  std::vector<double> weights(n);
  for (auto& w : weights) w = 1.0 + 0.001 * dist(eng);
  double total = std::accumulate(weights.begin(), weights.end(), 0.0);
  std::cout << "[weights]\n";
  for (auto& w : weights) std::cout << w << ' ';
  std::cout << std::endl;

  // generate markov chain
  int x = 0;
  {
    std::cout << "[Metropolis]\n";
    bcl::markov<engine_type> mc(bcl::metropolis(), weights);
    std::vector<double> accum(n, 0);
    for (unsigned int t = 0; t < samples; ++t) ++accum[x = mc(x, eng)];
    std::cout << "bin\tweight\t\tresult\t\tdiff\t\tsigma\t\tdiff/sigma\n";
    for (unsigned int i = 0; i < n; ++i) {
      double diff = std::abs((weights[i] / total) - (accum[i] / samples));
      double sigma = std::sqrt(accum[i]) / samples;
      std::cout << i << "\t" << (weights[i] / total) << "    \t"
                << (accum[i] / samples) << "    \t" << diff << "    \t"
                << sigma << "    \t" << (diff / sigma) << std::endl;
    }
  }
  {
    std::cout << "[Metropolis (choose_next)]\n";
    std::vector<double> accum(n, 0);
    for (unsigned int t = 0; t < samples; ++t)
      ++accum[x = bcl::metropolis::choose_next(weights, x, eng)];
    std::cout << "bin\tweight\t\tresult\t\tdiff\t\tsigma\t\tdiff/sigma\n";
    for (unsigned int i = 0; i < n; ++i) {
      double diff = std::abs((weights[i] / total) - (accum[i] / samples));
      double sigma = std::sqrt(accum[i]) / samples;
      std::cout << i << "\t" << (weights[i] / total) << "    \t"
                << (accum[i] / samples) << "    \t" << diff << "    \t"
                << sigma << "    \t" << (diff / sigma) << std::endl;
    }
  }
  {
    std::cout << "[heat bath]\n";
    bcl::markov<engine_type> mc(bcl::heatbath(), weights);
    std::vector<double> accum(n, 0);
    for (unsigned int t = 0; t < samples; ++t) ++accum[x = mc(x, eng)];
    std::cout << "bin\tweight\t\tresult\t\tdiff\t\tsigma\t\tdiff/sigma\n";
    for (unsigned int i = 0; i < n; ++i) {
      double diff = std::abs((weights[i] / total) - (accum[i] / samples));
      double sigma = std::sqrt(accum[i]) / samples;
      std::cout << i << "\t" << (weights[i] / total) << "    \t"
                << (accum[i] / samples) << "    \t" << diff << "    \t"
                << sigma << "    \t" << (diff / sigma) << std::endl;
    }
  }
  {
    std::cout << "[heat bath (choose_next)]\n";
    std::vector<double> accum(n, 0);
    for (unsigned int t = 0; t < samples; ++t)
      ++accum[x = bcl::heatbath::choose_next(weights, x, eng)];
    std::cout << "bin\tweight\t\tresult\t\tdiff\t\tsigma\t\tdiff/sigma\n";
    for (unsigned int i = 0; i < n; ++i) {
      double diff = std::abs((weights[i] / total) - (accum[i] / samples));
      double sigma = std::sqrt(accum[i]) / samples;
      std::cout << i << "\t" << (weights[i] / total) << "    \t"
                << (accum[i] / samples) << "    \t" << diff << "    \t"
                << sigma << "    \t" << (diff / sigma) << std::endl;
    }
  }
  {
    std::cout << "[Suwa-Todo 2010]\n";
    bcl::markov<engine_type> mc(bcl::st2010(), weights);
    std::vector<double> accum(n, 0);
    for (unsigned int t = 0; t < samples; ++t) ++accum[x = mc(x, eng)];
    std::cout << "bin\tweight\t\tresult\t\tdiff\t\tsigma\t\tdiff/sigma\n";
    for (unsigned int i = 0; i < n; ++i) {
      double diff = std::abs((weights[i] / total) - (accum[i] / samples));
      double sigma = std::sqrt(accum[i]) / samples;
      std::cout << i << "\t" << (weights[i] / total) << "    \t"
                << (accum[i] / samples) << "    \t" << diff << "    \t"
                << sigma << "    \t" << (diff / sigma) << std::endl;
    }
  }
  {
    std::cout << "[Suwa-Todo 2010 (choose_next)]\n";
    std::vector<double> accum(n, 0);
    for (unsigned int t = 0; t < samples; ++t)
      ++accum[x = bcl::st2010::choose_next(weights, x, eng)];
    std::cout << "bin\tweight\t\tresult\t\tdiff\t\tsigma\t\tdiff/sigma\n";
    for (unsigned int i = 0; i < n; ++i) {
      double diff = std::abs((weights[i] / total) - (accum[i] / samples));
      double sigma = std::sqrt(accum[i]) / samples;
      std::cout << i << "\t" << (weights[i] / total) << "    \t"
                << (accum[i] / samples) << "    \t" << diff << "    \t"
                << sigma << "    \t" << (diff / sigma) << std::endl;
    }
  }
  {
    std::cout << "[Suwa-Todo 2013]\n";
    bcl::markov<engine_type> mc(bcl::st2013(), weights);
    std::vector<double> accum(n, 0);
    for (unsigned int t = 0; t < samples; ++t) ++accum[x = mc(x, eng)];
    std::cout << "bin\tweight\t\tresult\t\tdiff\t\tsigma\t\tdiff/sigma\n";
    for (unsigned int i = 0; i < n; ++i) {
      double diff = std::abs((weights[i] / total) - (accum[i] / samples));
      double sigma = std::sqrt(accum[i]) / samples;
      std::cout << i << "\t" << (weights[i] / total) << "    \t"
                << (accum[i] / samples) << "    \t" << diff << "    \t"
                << sigma << "    \t" << (diff / sigma) << std::endl;
    }
  }
}
catch (const std::exception& excp) {
  std::cerr << excp.what() << std::endl;
  std::exit(-1); }
catch (...) {
  std::cerr << "Unknown exception occurred!" << std::endl;
  std::exit(-1); }
}